

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O2

int nextSwap(swapInfo *x)

{
  int iVar1;
  varInfo *pvVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  uVar4 = x->varN;
  while( true ) {
    if ((int)uVar4 < 2) {
      return 0;
    }
    pvVar2 = x->posArray;
    piVar3 = x->realArray;
    lVar7 = (long)pvVar2[uVar4].direction + (long)pvVar2[uVar4].position;
    if (piVar3[lVar7] < (int)uVar4) break;
    uVar4 = uVar4 - 1;
  }
  pvVar2[uVar4].position = (int)lVar7;
  iVar1 = piVar3[lVar7];
  piVar3[lVar7] = uVar4;
  piVar3[(long)pvVar2[uVar4].position - (long)pvVar2[uVar4].direction] = iVar1;
  iVar5 = pvVar2[uVar4].position - pvVar2[uVar4].direction;
  pvVar2[iVar1].position = iVar5;
  for (uVar6 = x->varN; (int)uVar4 < (int)uVar6; uVar6 = uVar6 - 1) {
    pvVar2[uVar6].direction = -pvVar2[uVar6].direction;
  }
  x->positionToSwap1 = iVar5 + -1;
  x->positionToSwap2 = pvVar2[uVar4].position + -1;
  return 1;
}

Assistant:

int nextSwap(swapInfo* x)
{
	int i,j,temp;
	for(i=x->varN;i>1;i--)
	{
		if( i > x->realArray[x->posArray[i].position + x->posArray[i].direction] )
		{
			x->posArray[i].position = x->posArray[i].position + x->posArray[i].direction;
			temp = x->realArray[x->posArray[i].position];
			x->realArray[x->posArray[i].position] = i; 
			x->realArray[x->posArray[i].position - x->posArray[i].direction] = temp;
			x->posArray[temp].position = x->posArray[i].position - x->posArray[i].direction; 
			for(j=x->varN;j>i;j--)
			{
				x->posArray[j].direction = 	x->posArray[j].direction * -1;
			}
			x->positionToSwap1 = x->posArray[temp].position - 1;
			x->positionToSwap2 = x->posArray[i].position - 1;			
			return 1;
		}
		
	}
	return 0;	
}